

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O0

ChebyshevCollection * __thiscall
ChebTools::ChebyshevCollection::make_inverse
          (ChebyshevCollection *__return_storage_ptr__,ChebyshevCollection *this,size_t N,
          double xmin,double xmax,int Mnorm,double tol,int max_refine_passes,bool assume_monotonic,
          bool unsafe_evaluation)

{
  size_t xmax_00;
  int M;
  double tol_00;
  uint uVar1;
  double this_00;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  double callback;
  optional<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
  local_288;
  function<double_(double)> local_260;
  undefined1 local_240 [8];
  vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_> exps;
  anon_class_32_4_ff226609 f;
  anon_class_64_8_38687d7a get_xsolns;
  double ytol;
  double local_1a8;
  double local_1a0;
  NestedExpressionType local_198;
  double local_190;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_188;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  local_158;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  local_100;
  undefined1 local_80 [8];
  ArrayXd ynodes;
  size_t counter;
  double yxmax;
  double yxmin;
  double xmax_;
  double xmin_;
  bool unsafe_evaluation_local;
  bool assume_monotonic_local;
  double dStack_40;
  int max_refine_passes_local;
  double tol_local;
  undefined1 auStack_30 [4];
  int Mnorm_local;
  double xmax_local;
  double xmin_local;
  size_t N_local;
  ChebyshevCollection *this_local;
  
  xmin_._2_1_ = unsafe_evaluation;
  yxmin = xmax;
  xmax_ = xmin;
  xmin_._3_1_ = assume_monotonic;
  xmin_._4_4_ = max_refine_passes;
  dStack_40 = tol;
  tol_local._4_4_ = Mnorm;
  _auStack_30 = (ArrayXd *)xmax;
  xmax_local = xmin;
  xmin_local = (double)N;
  N_local = (size_t)this;
  this_local = __return_storage_ptr__;
  if (unsafe_evaluation) {
    yxmax = y_unsafe(this,xmin);
    counter = (size_t)y_unsafe(this,(double)_auStack_30);
  }
  else {
    yxmax = operator()(this,xmin);
    counter = (size_t)operator()(this,(double)_auStack_30);
  }
  if ((double)counter < yxmax) {
    std::swap<double>(&yxmax,(double *)&counter);
    std::swap<double>(&xmax_,&yxmin);
  }
  ynodes.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_190 = (double)counter - yxmax;
  this_01 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)get_CLnodes((size_t)xmin_local);
  local_198 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array(this_01);
  Eigen::operator*(&local_188,&local_190,(StorageBaseType *)&local_198);
  local_1a0 = (double)counter + yxmax;
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
  ::operator+(&local_158,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
               *)&local_188,&local_1a0);
  local_1a8 = 0.5;
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>>
  ::operator*(&local_100,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>>
               *)&local_158,&local_1a8);
  Eigen::Array<double,-1,1,0,-1,1>::
  Array<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>>
            ((Array<double,_1,1,0,_1,1> *)local_80,&local_100);
  Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::maxCoeff
            ((DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_80);
  Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::minCoeff
            ((DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_80);
  this_00 = xmin_local;
  f.counter = (size_t *)local_80;
  f.xmax = &xmax_local;
  f.get_xsolns = (anon_class_64_8_38687d7a *)auStack_30;
  exps.
  super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&f.counter;
  f.xmin = (double *)
           &ynodes.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  std::function<double(double)>::
  function<ChebTools::ChebyshevCollection::make_inverse(unsigned_long,double,double,int,double,int,bool,bool)const::_lambda(double)_2_&,void>
            ((function<double(double)> *)&local_260,
             (anon_class_32_4_ff226609 *)
             &exps.
              super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = tol_local._4_4_;
  tol_00 = dStack_40;
  M = xmin_._4_4_;
  xmax_00 = counter;
  callback = yxmax;
  std::
  optional<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
  ::optional();
  ChebyshevExpansion::
  dyadic_splitting<std::vector<ChebTools::ChebyshevExpansion,std::allocator<ChebTools::ChebyshevExpansion>>>
            ((vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
              *)local_240,(ChebyshevExpansion *)this_00,(size_t)&local_260,
             (function<double_(double)> *)(ulong)uVar1,callback,(double)xmax_00,M,tol_00,
             (int)&local_288,
             (optional<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
              *)callback);
  std::
  optional<std::function<void_(int,_const_std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>_&)>_>
  ::~optional(&local_288);
  std::function<double_(double)>::~function(&local_260);
  ChebyshevCollection(__return_storage_ptr__,(Container *)local_240);
  std::vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>::
  ~vector((vector<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_> *)
          local_240);
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_80);
  return __return_storage_ptr__;
}

Assistant:

auto make_inverse(const std::size_t N, const double xmin, const double xmax,
            const int Mnorm, const double tol, const int max_refine_passes = 8, const bool assume_monotonic = true, const bool unsafe_evaluation=false) const {
            double xmin_ = xmin, xmax_ = xmax;
            double yxmin, yxmax;
            if (unsafe_evaluation){
                yxmin = (*this).y_unsafe(xmin); yxmax = (*this).y_unsafe(xmax);
            }
            else{
                yxmin = (*this)(xmin); yxmax = (*this)(xmax);
            }
            if (yxmin > yxmax) {
                std::swap(yxmin, yxmax);
                std::swap(xmin_, xmax_);
            }
            std::size_t counter = 0;

            // These are the values of y at the Chebyshev-Lobatto nodes for the inverse function
            // in the first pass
            Eigen::ArrayXd ynodes = ((yxmax - yxmin) * ChebTools::get_CLnodes(N).array() + (yxmax + yxmin)) * 0.5;
            // A small fudge factor is needed because there is a tiny loss in precision in calculation of ynodes
            // so it is not adequate to check direct float equality
            auto ytol = 2.2e-14*(ynodes.maxCoeff() - ynodes.minCoeff());

            auto get_xsolns = [&](double y) {
                std::vector<double> xsolns;
                auto ranges_overlap = [](double x1, double x2, double y1, double y2) { return x1 <= y2 && y1 <= x2; };

                // If a value of y precisely matches a value at the node, return the value of x at the node
                // This is important if the value of y is an extremum of y(x)
                if (std::abs(y - ynodes[0]) < ytol && assume_monotonic) { xsolns = { xmax_ }; }
                else if (std::abs(y - ynodes[ynodes.size() - 1]) < ytol && assume_monotonic) { xsolns = { xmin_ }; }
                else {
                    // Solve for values of x given this value of y
                    for (auto& ex : m_exps) {
                        if (assume_monotonic) {
                            auto yvals = ex.get_node_function_values();
                            auto ymin = yvals(0), ymax = yvals(yvals.size() - 1);
                            if (ymin > ymax) {
                                std::swap(ymin, ymax);
                            }
                            if (y >= ymin && y <= ymax) {
                                xsolns.emplace_back(ex.monotonic_solvex(y));
                            }
                        }
                        else {
                            if (ranges_overlap(ex.xmin(), ex.xmax(), xmin, xmax)) {
                                bool only_in_domain = true;
                                for (auto& rt : (ex - y).real_roots2(only_in_domain)) {
                                    xsolns.emplace_back(rt);
                                }
                                bool no_solns = xsolns.empty();
                                if (no_solns){
                                    if (std::abs(y - ynodes[0]) < ytol) { xsolns.push_back(xmax_); }
                                    if (std::abs(y - ynodes[ynodes.size() - 1]) < ytol) { xsolns.push_back(xmin_); }
                                }
                            }
                        }
                    }
                }
                return xsolns;
            };

            auto f = [&](double y) {
                
                auto xsolns = get_xsolns(y);
                auto xtol = 1e-14*(xmax - xmin);
                
                counter++;
                decltype(xsolns) good_solns;
                for (auto & xsoln : xsolns) {
                    if (xsoln >= xmin-xtol && xsoln <= xmax+xtol) {
                        good_solns.push_back(xsoln);
                    }
                }
                auto Ngood_solns = good_solns.size();
                if (Ngood_solns == 1) {
                    return good_solns.front();
                }
                else if (Ngood_solns == 0) {
                    throw std::invalid_argument("No good solutions found for y: " + std::to_string(y) + "; " + std::to_string(xsolns.size()) + " solutions had been found");
                }
                else {
                    for (auto soln : xsolns){
                        std::cout << soln << std::endl;
                    }
                    throw std::invalid_argument("Multiple solutions (is not one-to-one) for y: " + std::to_string(y) + "; " + std::to_string(Ngood_solns) + " solutions found");
                }
            };
            auto exps = ChebyshevExpansion::dyadic_splitting<Container>(N, f, yxmin, yxmax, Mnorm, tol, max_refine_passes);
            return ChebyshevCollection(exps);
        }